

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TToString.h
# Opt level: O3

string * __thiscall
duckdb_apache::thrift::
to_string<__gnu_cxx::__normal_iterator<duckdb_parquet::Encoding::type_const*,std::vector<duckdb_parquet::Encoding::type,std::allocator<duckdb_parquet::Encoding::type>>>>
          (string *__return_storage_ptr__,thrift *this,
          __normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
          *beg,__normal_iterator<const_duckdb_parquet::Encoding::type_*,_std::vector<duckdb_parquet::Encoding::type,_std::allocator<duckdb_parquet::Encoding::type>_>_>
               *end)

{
  type *extraout_RDX;
  type *extraout_RDX_00;
  type *extraout_RDX_01;
  type *extraout_RDX_02;
  type *val;
  duckdb_parquet *this_00;
  ostringstream o;
  string local_1c8;
  ostringstream local_1a8 [112];
  ios_base local_138 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_1a8);
  this_00 = *(duckdb_parquet **)this;
  if ((duckdb_parquet *)beg->_M_current != this_00) {
    val = extraout_RDX;
    do {
      if (this_00 != *(duckdb_parquet **)this) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", ",2);
        val = extraout_RDX_00;
      }
      duckdb_parquet::to_string_abi_cxx11_(&local_1c8,this_00,val);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
      val = extraout_RDX_01;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
        operator_delete(local_1c8._M_dataplus._M_p);
        val = extraout_RDX_02;
      }
      this_00 = this_00 + 4;
    } while (this_00 != (duckdb_parquet *)beg->_M_current);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream(local_1a8);
  std::ios_base::~ios_base(local_138);
  return __return_storage_ptr__;
}

Assistant:

std::string to_string(const T& beg, const T& end) {
  std::ostringstream o;
  for (T it = beg; it != end; ++it) {
    if (it != beg)
      o << ", ";
    o << to_string(*it);
  }
  return o.str();
}